

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::DumbDirectoryDatabase::write_entry
          (DumbDirectoryDatabase *this,ResourceTag tag,Hash hash,void *blob,size_t size,
          PayloadWriteFlags flags)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  FILE *__s;
  size_t sVar4;
  bool bVar5;
  allocator local_99;
  string path;
  char filename [25];
  string local_50;
  
  if ((flags & 1) != 0) {
    return false;
  }
  if (this->mode == ReadOnly) {
    return false;
  }
  iVar2 = (*(this->super_DatabaseInterface)._vptr_DatabaseInterface[5])(this);
  if ((char)iVar2 != '\0') {
    return true;
  }
  sprintf(filename,"%02x.%016lx.json",(ulong)tag,hash);
  std::__cxx11::string::string((string *)&local_50,filename,&local_99);
  Path::join(&path,&this->base_directory,&local_50);
  std::__cxx11::string::_M_dispose();
  __s = fopen(path._M_dataplus._M_p,"wb");
  if (__s == (FILE *)0x0) {
    LVar3 = get_thread_log_level();
    if ((int)LVar3 < 3) {
      bVar5 = false;
      bVar1 = Internal::log_thread_callback
                        (LOG_ERROR,"Failed to write serialized state to disk (%s).\n",
                         path._M_dataplus._M_p);
      if (!bVar1) {
        bVar5 = false;
        fprintf(_stderr,"Fossilize ERROR: Failed to write serialized state to disk (%s).\n",
                path._M_dataplus._M_p);
      }
      goto LAB_00107506;
    }
  }
  else {
    sVar4 = fwrite(blob,1,size,__s);
    if (sVar4 == size) {
      fclose(__s);
      bVar5 = true;
      goto LAB_00107506;
    }
    LVar3 = get_thread_log_level();
    if (((int)LVar3 < 3) &&
       (bVar1 = Internal::log_thread_callback
                          (LOG_ERROR,"Failed to write serialized state to disk.\n"), !bVar1)) {
      fwrite("Fossilize ERROR: Failed to write serialized state to disk.\n",0x3b,1,_stderr);
    }
    fclose(__s);
  }
  bVar5 = false;
LAB_00107506:
  std::__cxx11::string::_M_dispose();
  return bVar5;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t size, PayloadWriteFlags flags) override
	{
		if ((flags & PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (mode == DatabaseMode::ReadOnly)
			return false;

		if (has_entry(tag, hash))
			return true;

		char filename[25]; // 2 digits + "." + 16 digits + ".json" + null
		sprintf(filename, "%02x.%016" PRIx64 ".json", static_cast<unsigned>(tag), hash);
		auto path = Path::join(base_directory, filename);

		FILE *file = fopen(path.c_str(), "wb");
		if (!file)
		{
			LOGE_LEVEL("Failed to write serialized state to disk (%s).\n", path.c_str());
			return false;
		}

		if (fwrite(blob, 1, size, file) != size)
		{
			LOGE_LEVEL("Failed to write serialized state to disk.\n");
			fclose(file);
			return false;
		}

		fclose(file);
		return true;
	}